

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O1

void Omega_h::find_matches
               (Omega_h_Family family,Int dim,LOs *av2v,LOs *bv2v,Adj *v2b,Write<int> *a2b_out,
               Write<signed_char> *codes_out)

{
  int *piVar1;
  Alloc *pAVar2;
  Int ncomps;
  Read<int> local_b0;
  Read<int> local_a0;
  LOs local_90;
  Read<int> a2fv;
  Read<int> local_70;
  Adj local_60;
  
  if (dim < 3) {
    if (family == OMEGA_H_SIMPLEX) {
      ncomps = -1;
      if ((uint)dim < 4) {
        ncomps = dim + 1;
      }
    }
    else {
      ncomps = -1;
      if ((uint)dim < 4) {
        ncomps = *(Int *)(&DAT_0044eba8 + (ulong)(uint)dim * 4);
      }
    }
    local_70.write_.shared_alloc_.alloc = (av2v->write_).shared_alloc_.alloc;
    if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
        local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_70.write_.shared_alloc_.alloc =
             (Alloc *)((local_70.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_70.write_.shared_alloc_.alloc)->use_count =
             (local_70.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_70.write_.shared_alloc_.direct_ptr = (av2v->write_).shared_alloc_.direct_ptr;
    get_component<int>((Omega_h *)&a2fv,&local_70,ncomps,0);
    pAVar2 = local_70.write_.shared_alloc_.alloc;
    if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
        local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    local_90.write_.shared_alloc_.alloc = a2fv.write_.shared_alloc_.alloc;
    if (((ulong)a2fv.write_.shared_alloc_.alloc & 7) == 0 &&
        a2fv.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_90.write_.shared_alloc_.alloc =
             (Alloc *)((a2fv.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (a2fv.write_.shared_alloc_.alloc)->use_count =
             (a2fv.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_90.write_.shared_alloc_.direct_ptr = a2fv.write_.shared_alloc_.direct_ptr;
    local_a0.write_.shared_alloc_.alloc = (av2v->write_).shared_alloc_.alloc;
    if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_a0.write_.shared_alloc_.alloc =
             (Alloc *)((local_a0.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_a0.write_.shared_alloc_.alloc)->use_count =
             (local_a0.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_a0.write_.shared_alloc_.direct_ptr = (av2v->write_).shared_alloc_.direct_ptr;
    local_b0.write_.shared_alloc_.alloc = (bv2v->write_).shared_alloc_.alloc;
    if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b0.write_.shared_alloc_.alloc =
             (Alloc *)((local_b0.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_b0.write_.shared_alloc_.alloc)->use_count =
             (local_b0.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_b0.write_.shared_alloc_.direct_ptr = (bv2v->write_).shared_alloc_.direct_ptr;
    local_60.super_Graph.a2ab.write_.shared_alloc_.alloc =
         (v2b->super_Graph).a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_60.super_Graph.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
         (v2b->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
    local_60.super_Graph.ab2b.write_.shared_alloc_.alloc =
         (v2b->super_Graph).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_60.super_Graph.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
         (v2b->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
    local_60.codes.write_.shared_alloc_.alloc = (v2b->codes).write_.shared_alloc_.alloc;
    if (((ulong)local_60.codes.write_.shared_alloc_.alloc & 7) == 0 &&
        local_60.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_60.codes.write_.shared_alloc_.alloc =
             (Alloc *)((local_60.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_60.codes.write_.shared_alloc_.alloc)->use_count =
             (local_60.codes.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_60.codes.write_.shared_alloc_.direct_ptr = (v2b->codes).write_.shared_alloc_.direct_ptr;
    find_matches_ex<int>(ncomps,&local_90,&local_a0,&local_b0,&local_60,a2b_out,codes_out,false);
    Adj::~Adj(&local_60);
    pAVar2 = local_b0.write_.shared_alloc_.alloc;
    if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_b0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_b0.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_a0.write_.shared_alloc_.alloc;
    if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_a0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_90.write_.shared_alloc_.alloc;
    if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
        local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    if (((ulong)a2fv.write_.shared_alloc_.alloc & 7) == 0 &&
        a2fv.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(a2fv.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(a2fv.write_.shared_alloc_.alloc);
        operator_delete(a2fv.write_.shared_alloc_.alloc,0x48);
      }
    }
    return;
  }
  fail("assertion %s failed at %s +%d\n","dim <= 2",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
       ,0x1a2);
}

Assistant:

void find_matches(Omega_h_Family const family, Int const dim, LOs const av2v,
    LOs const bv2v, Adj const v2b, Write<LO>* a2b_out, Write<I8>* codes_out) {
  OMEGA_H_CHECK(dim <= 2);
  auto const deg = element_degree(family, dim, VERT);
  auto const a2fv = get_component(av2v, deg, 0);
  find_matches_ex(deg, a2fv, av2v, bv2v, v2b, a2b_out, codes_out);
}